

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptorProto::MergeFrom
          (MethodDescriptorProto *this,MethodDescriptorProto *from)

{
  uint uVar1;
  MethodOptions *in_RSI;
  MethodDescriptorProto *in_RDI;
  uint32 cached_has_bits;
  UnknownFieldSet *in_stack_ffffffffffffff08;
  MethodDescriptorProto *in_stack_ffffffffffffff10;
  MethodDescriptorProto *this_00;
  string *in_stack_ffffffffffffff28;
  MethodOptions *in_stack_ffffffffffffff88;
  
  this_00 = (MethodDescriptorProto *)&in_RSI->_extensions_;
  if (((uint)((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               *)&((ExtensionSet *)this_00)->arena_)->ptr_ & 1) == 1) {
    if (((uint)((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 *)&((ExtensionSet *)this_00)->arena_)->ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
      in_stack_ffffffffffffff10 = this_00;
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
      in_stack_ffffffffffffff10 = this_00;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  uVar1 = ((HasBits<1UL> *)&(in_RSI->_extensions_).flat_capacity_)->has_bits_[0];
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_name_abi_cxx11_((MethodDescriptorProto *)0x52287f);
      _internal_set_name(in_RDI,in_stack_ffffffffffffff28);
    }
    if ((uVar1 & 2) != 0) {
      _internal_input_type_abi_cxx11_((MethodDescriptorProto *)0x5228a5);
      _internal_set_input_type(in_RDI,in_stack_ffffffffffffff28);
    }
    if ((uVar1 & 4) != 0) {
      _internal_output_type_abi_cxx11_((MethodDescriptorProto *)0x5228cb);
      _internal_set_output_type(in_RDI,in_stack_ffffffffffffff28);
    }
    if ((uVar1 & 8) != 0) {
      _internal_mutable_options(in_stack_ffffffffffffff10);
      _internal_options((MethodDescriptorProto *)in_RSI);
      MethodOptions::MergeFrom(in_RSI,in_stack_ffffffffffffff88);
    }
    if ((uVar1 & 0x10) != 0) {
      in_RDI->client_streaming_ =
           (bool)(*(bool *)&(in_RSI->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_
                 & 1);
    }
    if ((uVar1 & 0x20) != 0) {
      in_RDI->server_streaming_ =
           (bool)(*(bool *)((long)&(in_RSI->uninterpreted_option_).super_RepeatedPtrFieldBase.
                                   current_size_ + 1) & 1);
    }
    (in_RDI->_has_bits_).has_bits_[0] = uVar1 | (in_RDI->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void MethodDescriptorProto::MergeFrom(const MethodDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.MethodDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000003fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_input_type(from._internal_input_type());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_output_type(from._internal_output_type());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::MethodOptions::MergeFrom(from._internal_options());
    }
    if (cached_has_bits & 0x00000010u) {
      client_streaming_ = from.client_streaming_;
    }
    if (cached_has_bits & 0x00000020u) {
      server_streaming_ = from.server_streaming_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}